

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O1

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CIfStm *statement)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IExpression *pIVar2;
  IStatement *pIVar3;
  ISubtreeWrapper *pIVar4;
  CLabelStatement *pCVar5;
  CSeqStatement *pCVar6;
  CLabelStatement *this_00;
  CSeqStatement *pCVar7;
  CJumpStatement *this_01;
  CSeqStatement *this_02;
  ISubtreeWrapper *pIVar8;
  CLabel labelJoin;
  CLabel labelFalse;
  CLabel labelTrue;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_1e0 [2];
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_1d0;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_1c8;
  ISubtreeWrapper *local_1c0;
  ISubtreeWrapper *local_1b8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_1b0;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_1a8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_1a0;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_198;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_190;
  _Head_base<0UL,_const_IRT::CLabelStatement_*,_false> local_188;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_180;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_178;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_170;
  ISubtreeWrapper *local_168;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_160;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_158;
  CLabel local_150;
  CLabel local_130;
  CLabel local_110;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  CLabel local_b0;
  CLabel local_90;
  CLabel local_70;
  CLabel local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"IRT builder: CIfStm\n",0x14);
  pIVar2 = (statement->conditionExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  local_1c0 = (this->wrapper)._M_t.
              super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
              ._M_t.
              super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
              .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  pIVar3 = (statement->positiveStatement)._M_t.
           super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
           super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
           super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
  (*(code *)*(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
  pIVar4 = (this->wrapper)._M_t.
           super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
           _M_t.
           super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
           .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  pIVar3 = (statement->negativeStatement)._M_t.
           super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
           super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
           super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
  local_1b8 = pIVar4;
  (*(code *)*(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
  local_168 = (this->wrapper)._M_t.
              super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
              ._M_t.
              super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
              .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  if (pIVar4 == (ISubtreeWrapper *)0x0) {
    __assert_fail("wrapperTargetPositive != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/CBuildVisitor.cpp"
                  ,0x187,"virtual void CBuildVisitor::Visit(CIfStm &)");
  }
  if (local_168 != (ISubtreeWrapper *)0x0) {
    IRT::CLabel::CLabel(&local_110);
    IRT::CLabel::CLabel(&local_130);
    IRT::CLabel::CLabel(&local_150);
    pCVar5 = (CLabelStatement *)operator_new(0x28);
    paVar1 = &local_50.label.field_2;
    local_50.label._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_150.label._M_dataplus._M_p,
               local_150.label._M_dataplus._M_p + local_150.label._M_string_length);
    IRT::CLabelStatement::CLabelStatement(pCVar5,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.label._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.label._M_dataplus._M_p);
    }
    pCVar6 = (CSeqStatement *)operator_new(0x18);
    this_00 = (CLabelStatement *)operator_new(0x28);
    paVar1 = &local_70.label.field_2;
    local_70.label._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_130.label._M_dataplus._M_p,
               local_130.label._M_dataplus._M_p + local_130.label._M_string_length);
    IRT::CLabelStatement::CLabelStatement(this_00,&local_70);
    local_1c8._M_head_impl = (CStatement *)this_00;
    pCVar7 = (CSeqStatement *)operator_new(0x18);
    (*local_168->_vptr_ISubtreeWrapper[1])(local_1e0);
    local_178._M_head_impl = local_1e0[0]._M_head_impl;
    local_1e0[0]._M_head_impl = (CStatement *)0x0;
    local_180._M_head_impl = (CStatement *)pCVar5;
    IRT::CSeqStatement::CSeqStatement
              (pCVar7,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                       *)&local_178,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_180);
    local_170._M_head_impl = (CStatement *)pCVar7;
    IRT::CSeqStatement::CSeqStatement
              (pCVar6,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                       *)&local_1c8,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_170);
    if ((CSeqStatement *)local_170._M_head_impl != (CSeqStatement *)0x0) {
      (*((INode *)&((local_170._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_170._M_head_impl = (CStatement *)0x0;
    if ((CLabelStatement *)local_180._M_head_impl != (CLabelStatement *)0x0) {
      (*((INode *)&((local_180._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_180._M_head_impl = (CStatement *)0x0;
    if (local_178._M_head_impl != (CStatement *)0x0) {
      (*((local_178._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_178._M_head_impl = (CStatement *)0x0;
    if (local_1e0[0]._M_head_impl != (CStatement *)0x0) {
      (*((local_1e0[0]._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    if ((CLabelStatement *)local_1c8._M_head_impl != (CLabelStatement *)0x0) {
      (*((INode *)&((local_1c8._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_1c8._M_head_impl = (CStatement *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.label._M_dataplus._M_p != paVar1) {
      operator_delete(local_70.label._M_dataplus._M_p);
    }
    pCVar7 = (CSeqStatement *)operator_new(0x18);
    this_01 = (CJumpStatement *)operator_new(0x10);
    pCVar5 = (CLabelStatement *)operator_new(0x28);
    paVar1 = &local_90.label.field_2;
    local_90.label._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_150.label._M_dataplus._M_p,
               local_150.label._M_dataplus._M_p + local_150.label._M_string_length);
    IRT::CLabelStatement::CLabelStatement(pCVar5,&local_90);
    local_188._M_head_impl = pCVar5;
    IRT::CJumpStatement::CJumpStatement
              (this_01,(unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                        *)&local_188);
    local_190._M_head_impl = (CStatement *)pCVar6;
    local_158._M_head_impl = (CStatement *)this_01;
    IRT::CSeqStatement::CSeqStatement
              (pCVar7,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                       *)&local_158,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_190);
    if ((CSeqStatement *)local_190._M_head_impl != (CSeqStatement *)0x0) {
      (*((INode *)&((local_190._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_190._M_head_impl = (CStatement *)0x0;
    if ((CJumpStatement *)local_158._M_head_impl != (CJumpStatement *)0x0) {
      (*((INode *)&((local_158._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_158._M_head_impl = (CStatement *)0x0;
    if (local_188._M_head_impl != (CLabelStatement *)0x0) {
      (*((local_188._M_head_impl)->super_CStatement).super_IStatement.super_INode._vptr_INode[2])();
    }
    local_188._M_head_impl = (CLabelStatement *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.label._M_dataplus._M_p != paVar1) {
      operator_delete(local_90.label._M_dataplus._M_p);
    }
    pCVar6 = (CSeqStatement *)operator_new(0x18);
    pCVar5 = (CLabelStatement *)operator_new(0x28);
    paVar1 = &local_b0.label.field_2;
    local_b0.label._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_110.label._M_dataplus._M_p,
               local_110.label._M_dataplus._M_p + local_110.label._M_string_length);
    IRT::CLabelStatement::CLabelStatement(pCVar5,&local_b0);
    local_1d0._M_head_impl = (CStatement *)pCVar5;
    this_02 = (CSeqStatement *)operator_new(0x18);
    (*local_1b8->_vptr_ISubtreeWrapper[1])(local_1e0);
    local_1a0._M_head_impl = local_1e0[0]._M_head_impl;
    local_1e0[0]._M_head_impl = (CStatement *)0x0;
    local_1a8._M_head_impl = (CStatement *)pCVar7;
    IRT::CSeqStatement::CSeqStatement
              (this_02,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                        *)&local_1a0,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_1a8);
    local_198._M_head_impl = (CStatement *)this_02;
    IRT::CSeqStatement::CSeqStatement
              (pCVar6,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                       *)&local_1d0,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_198);
    if ((CSeqStatement *)local_198._M_head_impl != (CSeqStatement *)0x0) {
      (*((INode *)&((local_198._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_198._M_head_impl = (CStatement *)0x0;
    if ((CSeqStatement *)local_1a8._M_head_impl != (CSeqStatement *)0x0) {
      (*((INode *)&((local_1a8._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_1a8._M_head_impl = (CStatement *)0x0;
    if (local_1a0._M_head_impl != (CStatement *)0x0) {
      (*((local_1a0._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_1a0._M_head_impl = (CStatement *)0x0;
    if (local_1e0[0]._M_head_impl != (CStatement *)0x0) {
      (*((local_1e0[0]._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    if ((CLabelStatement *)local_1d0._M_head_impl != (CLabelStatement *)0x0) {
      (*((INode *)&((local_1d0._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_1d0._M_head_impl = (CStatement *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.label._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0.label._M_dataplus._M_p);
    }
    pIVar8 = (ISubtreeWrapper *)operator_new(0x10);
    pCVar7 = (CSeqStatement *)operator_new(0x18);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,local_110.label._M_dataplus._M_p,
               local_110.label._M_dataplus._M_p + local_110.label._M_string_length);
    local_f0[0] = local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_f0,local_130.label._M_dataplus._M_p,
               local_130.label._M_dataplus._M_p + local_130.label._M_string_length);
    (*local_1c0->_vptr_ISubtreeWrapper[2])(local_1e0,local_1c0,local_d0,local_f0);
    local_160._M_head_impl = local_1e0[0]._M_head_impl;
    local_1e0[0]._M_head_impl = (CStatement *)0x0;
    local_1b0._M_head_impl = (CStatement *)pCVar6;
    IRT::CSeqStatement::CSeqStatement
              (pCVar7,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                       *)&local_160,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_1b0);
    pIVar8->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_001834e0;
    pIVar8[1]._vptr_ISubtreeWrapper = (_func_int **)pCVar7;
    pIVar4 = (this->wrapper)._M_t.
             super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
             .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
    (this->wrapper)._M_t.
    super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
    super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
    super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = pIVar8;
    if (pIVar4 != (ISubtreeWrapper *)0x0) {
      operator_delete(pIVar4);
    }
    if ((CSeqStatement *)local_1b0._M_head_impl != (CSeqStatement *)0x0) {
      (*((INode *)&((local_1b0._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_1b0._M_head_impl = (CStatement *)0x0;
    if (local_160._M_head_impl != (CStatement *)0x0) {
      (*((local_160._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_160._M_head_impl = (CStatement *)0x0;
    if (local_1e0[0]._M_head_impl != (CStatement *)0x0) {
      (*((local_1e0[0]._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_1e0[0]._M_head_impl = (CStatement *)0x0;
    if (local_f0[0] != local_e0) {
      operator_delete(local_f0[0]);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
    }
    pIVar8 = local_168;
    pIVar4 = local_1b8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.label._M_dataplus._M_p != &local_150.label.field_2) {
      operator_delete(local_150.label._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.label._M_dataplus._M_p != &local_130.label.field_2) {
      operator_delete(local_130.label._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.label._M_dataplus._M_p != &local_110.label.field_2) {
      operator_delete(local_110.label._M_dataplus._M_p);
    }
    operator_delete(pIVar8);
    operator_delete(pIVar4);
    operator_delete(local_1c0);
    return;
  }
  __assert_fail("wrapperTargetNegative != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/CBuildVisitor.cpp"
                ,0x188,"virtual void CBuildVisitor::Visit(CIfStm &)");
}

Assistant:

void CBuildVisitor::Visit( CIfStm &statement ) {
    std::cout << "IRT builder: CIfStm\n";
    statement.conditionExpression->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperCondition = std::move( wrapper );
    statement.positiveStatement->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperTargetPositive = std::move( wrapper );
    statement.negativeStatement->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperTargetNegative = std::move( wrapper );

    assert( wrapperTargetPositive != nullptr );
    assert( wrapperTargetNegative != nullptr );

    IRT::CLabel labelTrue;
    IRT::CLabel labelFalse;
    IRT::CLabel labelJoin;

    std::unique_ptr<const IRT::CStatement> suffix( new IRT::CLabelStatement( labelJoin ));

    suffix = std::move( std::unique_ptr<const IRT::CStatement>(
            new IRT::CSeqStatement(
                    std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CLabelStatement( labelFalse ))),
                    std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                            std::move( wrapperTargetNegative->ToStatement( )),
                            std::move( suffix )
                    )))
            )
    ));

    suffix = std::move( std::unique_ptr<const IRT::CStatement>(
            new IRT::CSeqStatement(
                    std::move( std::unique_ptr<const IRT::CStatement>(
                            new IRT::CJumpStatement( std::move( std::unique_ptr<const IRT::CLabelStatement>(
                                    new IRT::CLabelStatement(
                                            labelJoin
                                    )
                            )))
                    )),
                    std::move( suffix )
            )
    ));

    suffix = std::move( std::unique_ptr<const IRT::CStatement>(
            new IRT::CSeqStatement(
                    std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CLabelStatement( labelTrue ))),
                    std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                            std::move( wrapperTargetPositive->ToStatement( )),
                            std::move( suffix )
                    )))
            )
    ));

    updateSubtreeWrapper( new IRT::CStatementWrapper(
            new IRT::CSeqStatement(
                    std::move( wrapperCondition->ToConditional( labelTrue, labelFalse )),
                    std::move( suffix )
            )
    ));
}